

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O3

int evmap_reinit_(event_base *base)

{
  long *plVar1;
  uint in_EAX;
  int iVar2;
  long lVar3;
  int result;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  evmap_io_foreach_fd(base,evmap_io_reinit_iter_fn,(void *)((long)&uStack_18 + 4));
  if ((long)uStack_18 < 0) {
    uStack_18._4_4_ = -1;
  }
  else {
    iVar2 = (base->sigmap).nentries;
    if (0 < iVar2) {
      lVar3 = 0;
      do {
        plVar1 = (long *)(base->sigmap).entries[lVar3];
        if (plVar1 != (long *)0x0) {
          if (*plVar1 != 0) {
            iVar2 = (*base->evsigsel->add)(base,(int)lVar3,0,8,(void *)0x0);
            if (iVar2 == -1) {
              uStack_18 = CONCAT44(0xffffffff,(undefined4)uStack_18);
            }
          }
          iVar2 = (base->sigmap).nentries;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < iVar2);
    }
    uStack_18._4_4_ = uStack_18._4_4_ >> 0x1f;
  }
  return uStack_18._4_4_;
}

Assistant:

int
evmap_reinit_(struct event_base *base)
{
	int result = 0;

	evmap_io_foreach_fd(base, evmap_io_reinit_iter_fn, &result);
	if (result < 0)
		return -1;
	evmap_signal_foreach_signal(base, evmap_signal_reinit_iter_fn, &result);
	if (result < 0)
		return -1;
	return 0;
}